

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

string * returnUngapped(string *__return_storage_ptr__,string *input_sequence,
                       string *consensus_structure)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char x;
  char y;
  int iVar3;
  pointer pcVar4;
  pointer pcVar5;
  undefined8 uVar6;
  string *psVar7;
  bool bVar8;
  uint uVar9;
  void *pvVar10;
  void **ppvVar11;
  size_type sVar12;
  _Head_base<1UL,_int,_false> _Var13;
  ulong uVar14;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> paren;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> lts;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> cb;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> sb;
  tuple<char,_int> local_d0;
  void *local_c8;
  void *pvStack_c0;
  long local_b8;
  void *local_a8;
  void *pvStack_a0;
  long local_98;
  void *local_88;
  void *pvStack_80;
  long local_78;
  void *local_68;
  void *pvStack_60;
  long local_58;
  string *local_50;
  string *local_48;
  ulong local_40;
  size_type local_38;
  
  sVar12 = consensus_structure->_M_string_length;
  local_b8 = 0;
  local_c8 = (void *)0x0;
  pvStack_c0 = (void *)0x0;
  local_58 = 0;
  local_68 = (void *)0x0;
  pvStack_60 = (void *)0x0;
  local_78 = 0;
  local_88 = (void *)0x0;
  pvStack_80 = (void *)0x0;
  local_98 = 0;
  local_a8 = (void *)0x0;
  pvStack_a0 = (void *)0x0;
  local_50 = input_sequence;
  local_48 = __return_storage_ptr__;
  if (0 < (int)(uint)sVar12) {
    local_40 = (ulong)((uint)sVar12 & 0x7fffffff);
    uVar14 = 0;
    local_38 = sVar12;
    do {
      pcVar4 = (consensus_structure->_M_dataplus)._M_p;
      bVar2 = pcVar4[uVar14];
      _Var13._M_head_impl = (int)uVar14;
      if (bVar2 < 0x5b) {
        if (bVar2 < 0x3c) {
          if (bVar2 == 0x28) {
            local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>.
            _M_head_impl = '(';
            local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl =
                 (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
            std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
            emplace_back<std::tuple<char,int>>
                      ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)
                       &local_c8,&local_d0);
          }
          else if ((bVar2 == 0x29) &&
                  (ppvVar11 = &pvStack_c0, pvVar10 = pvStack_c0, local_c8 != pvStack_c0)) {
LAB_0011709a:
            iVar3 = *(int *)((long)pvVar10 + -8);
            *ppvVar11 = (void *)((long)pvVar10 + -8);
            pcVar5 = (local_50->_M_dataplus)._M_p;
            x = pcVar5[uVar14];
            y = pcVar5[iVar3];
            bVar8 = canMatch(x,y);
            if (!bVar8) {
              if (x == '-') {
                pcVar4[iVar3] = '.';
              }
              else {
                pcVar4[uVar14] = '.';
                if (y != '-') {
                  (consensus_structure->_M_dataplus)._M_p[iVar3] = '.';
                }
              }
            }
          }
        }
        else if (bVar2 == 0x3c) {
          local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl
               = '<';
          local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
          std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
          emplace_back<std::tuple<char,int>>
                    ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_a8,
                     &local_d0);
        }
        else if ((bVar2 == 0x3e) &&
                (ppvVar11 = &pvStack_a0, pvVar10 = pvStack_a0, local_a8 != pvStack_a0))
        goto LAB_0011709a;
      }
      else if (bVar2 < 0x7b) {
        if (bVar2 == 0x5b) {
          local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl
               = '[';
          local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
          std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
          emplace_back<std::tuple<char,int>>
                    ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_68,
                     &local_d0);
        }
        else if ((bVar2 == 0x5d) &&
                (ppvVar11 = &pvStack_60, pvVar10 = pvStack_60, local_68 != pvStack_60))
        goto LAB_0011709a;
      }
      else if (bVar2 == 0x7b) {
        local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
             '{';
        local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
        std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
        emplace_back<std::tuple<char,int>>
                  ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_88,
                   &local_d0);
      }
      else if ((bVar2 == 0x7d) &&
              (ppvVar11 = &pvStack_80, pvVar10 = pvStack_80, local_88 != pvStack_80))
      goto LAB_0011709a;
      uVar14 = uVar14 + 1;
    } while (local_40 != uVar14);
    sVar12 = local_38;
    if (local_c8 != pvStack_c0) goto LAB_00117404;
  }
  if (((local_a8 == pvStack_a0) && (local_68 == pvStack_60)) && (local_88 == pvStack_80)) {
    uVar9 = (int)local_50->_M_string_length - 1;
    if (-1 < (int)uVar9) {
      uVar14 = (ulong)uVar9;
      do {
        if ((local_50->_M_dataplus)._M_p[uVar14] == '-') {
          std::__cxx11::string::erase((ulong)consensus_structure,uVar14);
        }
        bVar8 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar8);
    }
    if (0 < (int)(uint)sVar12) {
      uVar14 = 0;
      do {
        pcVar4 = (consensus_structure->_M_dataplus)._M_p;
        bVar2 = pcVar4[uVar14];
        _Var13._M_head_impl = (int)uVar14;
        if (bVar2 < 0x5b) {
          if (bVar2 < 0x3c) {
            if (bVar2 == 0x28) {
              local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>.
              _M_head_impl = '(';
              local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
              super__Head_base<1UL,_int,_false>._M_head_impl =
                   (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
              std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
              emplace_back<std::tuple<char,int>>
                        ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)
                         &local_c8,&local_d0);
            }
            else if ((bVar2 == 0x29) &&
                    (pvVar10 = pvStack_c0, ppvVar11 = &pvStack_c0, local_c8 != pvStack_c0)) {
LAB_001172c0:
              iVar3 = *(int *)((long)pvVar10 + -8);
              *ppvVar11 = (void *)((long)pvVar10 + -8);
              if (_Var13._M_head_impl - iVar3 < 4) {
                pcVar4[uVar14] = '.';
                (consensus_structure->_M_dataplus)._M_p[iVar3] = '.';
              }
            }
          }
          else if (bVar2 == 0x3c) {
            local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>.
            _M_head_impl = '<';
            local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl =
                 (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
            std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
            emplace_back<std::tuple<char,int>>
                      ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)
                       &local_a8,&local_d0);
          }
          else if ((bVar2 == 0x3e) &&
                  (ppvVar11 = &pvStack_a0, pvVar10 = pvStack_a0, local_a8 != pvStack_a0))
          goto LAB_001172c0;
        }
        else if (bVar2 < 0x7b) {
          if (bVar2 == 0x5b) {
            local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>.
            _M_head_impl = '[';
            local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl =
                 (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
            std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
            emplace_back<std::tuple<char,int>>
                      ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)
                       &local_68,&local_d0);
          }
          else if ((bVar2 == 0x5d) &&
                  (ppvVar11 = &pvStack_60, pvVar10 = pvStack_60, local_68 != pvStack_60))
          goto LAB_001172c0;
        }
        else if (bVar2 == 0x7b) {
          local_d0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl
               = '{';
          local_d0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var13._M_head_impl;
          std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
          emplace_back<std::tuple<char,int>>
                    ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_88,
                     &local_d0);
        }
        else if ((bVar2 == 0x7d) &&
                (ppvVar11 = &pvStack_80, pvVar10 = pvStack_80, local_88 != pvStack_80))
        goto LAB_001172c0;
        uVar14 = uVar14 + 1;
      } while (((uint)sVar12 & 0x7fffffff) != uVar14);
    }
    psVar7 = local_48;
    (local_48->_M_dataplus)._M_p = (pointer)&local_48->field_2;
    pcVar4 = (consensus_structure->_M_dataplus)._M_p;
    paVar1 = &consensus_structure->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar1) {
      uVar6 = *(undefined8 *)((long)&consensus_structure->field_2 + 8);
      (local_48->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&local_48->field_2 + 8) = uVar6;
    }
    else {
      (local_48->_M_dataplus)._M_p = pcVar4;
      (local_48->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_48->_M_string_length = consensus_structure->_M_string_length;
    (consensus_structure->_M_dataplus)._M_p = (pointer)paVar1;
    consensus_structure->_M_string_length = 0;
    (consensus_structure->field_2)._M_local_buf[0] = '\0';
    if (local_a8 != (void *)0x0) {
      operator_delete(local_a8,local_98 - (long)local_a8);
    }
    if (local_88 != (void *)0x0) {
      operator_delete(local_88,local_78 - (long)local_88);
    }
    if (local_68 != (void *)0x0) {
      operator_delete(local_68,local_58 - (long)local_68);
    }
    if (local_c8 != (void *)0x0) {
      operator_delete(local_c8,local_b8 - (long)local_c8);
    }
    return psVar7;
  }
LAB_00117404:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Error in reported structure. More left pairings than right pairings",0x43);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(0);
}

Assistant:

std::string returnUngapped(std::string input_sequence, std::string consensus_structure){
    int length = consensus_structure.length();

    std::vector<std::tuple<char,int> > paren;
    std::vector<std::tuple<char,int> > sb;
    std::vector<std::tuple<char,int> > cb;
    std::vector<std::tuple<char,int> > lts;
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        // Checks to see if the pair can match
        if(close){
            if(canMatch(input_sequence[i],input_sequence[std::get<1>(x)])){
                
                continue;
            }
            else{
                if(input_sequence[i] == '-'){
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }else if(input_sequence[std::get<1>(x)] == '-'){
                    consensus_structure[i] = '.';
                    continue;   
                }
                else{
                    consensus_structure[i] = '.';
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }
            }
        }    
    }
    // Reports if not all pairs were closed
    if(!paren.empty() || !lts.empty() || !sb.empty() || !cb.empty()){
        std::cout << "Error in reported structure. More left pairings than right pairings" << std::endl;
        exit(0); 
    }
    // Erase Gaps
    for(int i= input_sequence.length()-1; i>=0;--i){
        if(input_sequence[i] == '-') consensus_structure.erase(i,1);
    }

    // Checks for pairs less than 3 distance away
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        if(close){
            if(i-std::get<1>(x) < 4){
                consensus_structure[i] = '.';
                consensus_structure[std::get<1>(x)] = '.';
                continue;  
            }
        }
    }

return consensus_structure;

}